

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O1

int CmdCommandSetVariable(Abc_Frame_t *pAbc,int argc,char **argv)

{
  st__table *table;
  int iVar1;
  int iVar2;
  char *pcVar3;
  FILE *pFVar4;
  char *pcVar5;
  char *key;
  char *value;
  char *local_40;
  char *local_38;
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if ((iVar1 == -1) && (argc < 4 && argc != 0)) {
    if (argc == 1) {
      iVar1 = 0;
      CmdPrintTable(pAbc->tFlags,0);
    }
    else {
      local_40 = argv[1];
      iVar1 = st__delete(pAbc->tFlags,&local_40,&local_38);
      if (iVar1 != 0) {
        if (local_40 != (char *)0x0) {
          free(local_40);
          local_40 = (char *)0x0;
        }
        if (local_38 != (char *)0x0) {
          free(local_38);
          local_38 = (char *)0x0;
        }
      }
      if (argc == 2) {
        pcVar5 = "";
      }
      else {
        pcVar5 = argv[2];
      }
      pcVar5 = Extra_UtilStrsav(pcVar5);
      table = pAbc->tFlags;
      pcVar3 = Extra_UtilStrsav(argv[1]);
      st__insert(table,pcVar3,pcVar5);
      iVar1 = strcmp(argv[1],"abcout");
      if (iVar1 == 0) {
        if ((FILE *)pAbc->Out != _stdout) {
          fclose((FILE *)pAbc->Out);
        }
        pcVar3 = "-";
        if (*pcVar5 != '\0') {
          pcVar3 = pcVar5;
        }
        pFVar4 = CmdFileOpen(pAbc,pcVar3,"w",(char **)0x0,0);
        pAbc->Out = pFVar4;
        pcVar5 = pcVar3;
        if (pFVar4 == (FILE *)0x0) {
          pAbc->Out = (FILE *)_stdout;
        }
      }
      iVar1 = strcmp(argv[1],"abcerr");
      if (iVar1 == 0) {
        if ((FILE *)pAbc->Err != _stderr) {
          fclose((FILE *)pAbc->Err);
        }
        pcVar3 = "-";
        if (*pcVar5 != '\0') {
          pcVar3 = pcVar5;
        }
        pFVar4 = CmdFileOpen(pAbc,pcVar3,"w",(char **)0x0,0);
        pAbc->Err = pFVar4;
        pcVar5 = pcVar3;
        if (pFVar4 == (FILE *)0x0) {
          pAbc->Err = (FILE *)_stderr;
        }
      }
      iVar2 = strcmp(argv[1],"history");
      iVar1 = 0;
      if (iVar2 == 0) {
        if ((FILE *)pAbc->Hst != (FILE *)0x0) {
          fclose((FILE *)pAbc->Hst);
        }
        if (*pcVar5 == '\0') {
          pAbc->Hst = (FILE *)0x0;
        }
        else {
          iVar1 = 0;
          pFVar4 = CmdFileOpen(pAbc,pcVar5,"w",(char **)0x0,0);
          pAbc->Hst = pFVar4;
        }
      }
    }
  }
  else {
    fwrite("usage: set [-h] <name> <value>\n",0x1f,1,(FILE *)pAbc->Err);
    fwrite("\t        sets the value of parameter <name>\n",0x2c,1,(FILE *)pAbc->Err);
    fwrite("\t-h    : print the command usage\n",0x21,1,(FILE *)pAbc->Err);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int CmdCommandSetVariable( Abc_Frame_t * pAbc, int argc, char **argv )
{
    char *flag_value, *value;
    const char* key;
    int c;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc == 0 || argc > 3 )
    {
        goto usage;
    }
    else if ( argc == 1 )
    {
        CmdPrintTable( pAbc->tFlags, 0 );
        return 0;
    }
    else
    {
        key = argv[1];
        if ( st__delete( pAbc->tFlags, &key, &value ) )
        {
            ABC_FREE( key );
            ABC_FREE( value );
        }

        flag_value = argc == 2 ? Extra_UtilStrsav( "" ) : Extra_UtilStrsav( argv[2] );
//        flag_value = argc == 2 ? NULL : Extra_UtilStrsav(argv[2]);
        st__insert( pAbc->tFlags, Extra_UtilStrsav(argv[1]), flag_value );

        if ( strcmp( argv[1], "abcout" ) == 0 )
        {
            if ( pAbc->Out != stdout )
                fclose( pAbc->Out );
            if ( strcmp( flag_value, "" ) == 0 )
                flag_value = "-";
            pAbc->Out = CmdFileOpen( pAbc, flag_value, "w", NULL, 0 );
            if ( pAbc->Out == NULL )
                pAbc->Out = stdout;
#if HAVE_SETVBUF
            setvbuf( pAbc->Out, ( char * ) NULL, _IOLBF, 0 );
#endif
        }
        if ( strcmp( argv[1], "abcerr" ) == 0 )
        {
            if ( pAbc->Err != stderr )
                fclose( pAbc->Err );
            if ( strcmp( flag_value, "" ) == 0 )
                flag_value = "-";
            pAbc->Err = CmdFileOpen( pAbc, flag_value, "w", NULL, 0 );
            if ( pAbc->Err == NULL )
                pAbc->Err = stderr;
#if HAVE_SETVBUF
            setvbuf( pAbc->Err, ( char * ) NULL, _IOLBF, 0 );
#endif
        }
        if ( strcmp( argv[1], "history" ) == 0 )
        {
            if ( pAbc->Hst != NULL )
                fclose( pAbc->Hst );
            if ( strcmp( flag_value, "" ) == 0 )
                pAbc->Hst = NULL;
            else
            {
                pAbc->Hst = CmdFileOpen( pAbc, flag_value, "w", NULL, 0 );
                if ( pAbc->Hst == NULL )
                    pAbc->Hst = NULL;
            }
        }
        return 0;
    }

  usage:
    fprintf( pAbc->Err, "usage: set [-h] <name> <value>\n" );
    fprintf( pAbc->Err, "\t        sets the value of parameter <name>\n" );
    fprintf( pAbc->Err, "\t-h    : print the command usage\n" );
    return 1;

}